

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_stops_db(feed_db_t *db,stop_t **records)

{
  int iVar1;
  stop_t *psVar2;
  uchar *puVar3;
  double dVar4;
  char local_4b8 [8];
  char qr [190];
  sqlite3_stmt *local_3f0;
  sqlite3_stmt *stmt;
  int local_3e0;
  int i;
  int record_count;
  feed_db_status_t res;
  stop_t record;
  stop_t **records_local;
  feed_db_t *db_local;
  
  local_3e0 = count_rows_db(db,"stops");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_3e0;
  if (0 < local_3e0) {
    memcpy(local_4b8,
           "SELECT stop_id, stop_code, stop_name, stop_desc,stop_lat, stop_lon,zone_id, stop_url,location_type, parent_station, stop_timezone, wheelchair_boarding, level_id, platform_code FROM `stops`;"
           ,0xbe);
    sqlite3_prepare_v2(db->conn,local_4b8,-1,&local_3f0,(char **)0x0);
    psVar2 = (stop_t *)malloc((long)local_3e0 * 0x3b0);
    *records = psVar2;
    if (*records == (stop_t *)0x0) {
      sqlite3_finalize(local_3f0);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_3f0);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_stop((stop_t *)&record_count);
        puVar3 = sqlite3_column_text(local_3f0,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,1);
        strcpy(record.id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,2);
        strcpy(record.code + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,3);
        strcpy(record.name + 0x38,(char *)puVar3);
        dVar4 = sqlite3_column_double(local_3f0,4);
        record._440_10_ = (BADTYPE)dVar4;
        dVar4 = sqlite3_column_double(local_3f0,5);
        record._456_10_ = (BADTYPE)dVar4;
        puVar3 = sqlite3_column_text(local_3f0,6);
        strcpy((char *)((long)&record.lon + 8),(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,7);
        strcpy(record.zone_id + 0x38,(char *)puVar3);
        record.url._120_4_ = sqlite3_column_int(local_3f0,8);
        puVar3 = sqlite3_column_text(local_3f0,9);
        strcpy(record.url + 0x7c,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,10);
        strcpy(record.parent_station + 0x38,(char *)puVar3);
        record.timezone._56_4_ = sqlite3_column_int(local_3f0,0xb);
        puVar3 = sqlite3_column_text(local_3f0,0xc);
        strcpy(record.timezone + 0x3c,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_3f0,0xd);
        strcpy(record.level_id + 0x38,(char *)puVar3);
        memcpy(*records + stmt._4_4_,&record_count,0x3b0);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_3e0);
      sqlite3_finalize(local_3f0);
      db_local._4_4_ = local_3e0;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_stops_db(feed_db_t *db, stop_t **records) {

    stop_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "stops");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "stop_id, stop_code, stop_name, stop_desc,"
                    "stop_lat, stop_lon,"
                    "zone_id, stop_url,"
                    "location_type, parent_station, stop_timezone, wheelchair_boarding, "
                    "level_id, platform_code "
                "FROM `stops`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_stop(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.code, sqlite3_column_text(stmt, 1));
        strcpy(record.name, sqlite3_column_text(stmt, 2));
        strcpy(record.desc, sqlite3_column_text(stmt, 3));
        record.lat = sqlite3_column_double(stmt, 4);
        record.lon = sqlite3_column_double(stmt, 5);
        strcpy(record.zone_id, sqlite3_column_text(stmt, 6));
        strcpy(record.url, sqlite3_column_text(stmt, 7));
        record.location_type = (location_type_t)sqlite3_column_int(stmt, 8);
        strcpy(record.parent_station, sqlite3_column_text(stmt, 9));
        strcpy(record.timezone, sqlite3_column_text(stmt, 10));
        record.wheelchair_boarding = (wheelchair_boarding_t)sqlite3_column_int(stmt, 11);
        strcpy(record.level_id, sqlite3_column_text(stmt, 12));
        strcpy(record.platform_code, sqlite3_column_text(stmt, 13));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}